

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

void __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::fillPriorityQueue(SimpleToMonotone *this)

{
  int *__first;
  long in_FS_OFFSET;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_upperVertex).siz = 0;
  QDataBuffer<int>::reserve(&this->m_upperVertex,(this->m_edges).siz);
  for (local_24 = 0; (long)local_24 < (this->m_edges).siz; local_24 = local_24 + 1) {
    QDataBuffer<int>::add(&this->m_upperVertex,&local_24);
  }
  __first = (this->m_upperVertex).buffer;
  std::
  __sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<QTriangulator<unsigned_int>::SimpleToMonotone::CompareVertices>>
            (__first,__first + (this->m_upperVertex).siz,
             (_Iter_comp_iter<QTriangulator<unsigned_int>::SimpleToMonotone::CompareVertices>)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTriangulator<T>::SimpleToMonotone::fillPriorityQueue()
{
    m_upperVertex.reset();
    m_upperVertex.reserve(m_edges.size());
    for (int i = 0; i < m_edges.size(); ++i)
        m_upperVertex.add(i);
    CompareVertices cmp(this);
    std::sort(m_upperVertex.data(), m_upperVertex.data() + m_upperVertex.size(), cmp);
    //for (int i = 1; i < m_upperVertex.size(); ++i) {
    //    Q_ASSERT(!cmp(m_upperVertex.at(i), m_upperVertex.at(i - 1)));
    //}
}